

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

bool __thiscall
amrex::BoxArray::coarsenable(BoxArray *this,IntVect *refinement_ratio,IntVect *min_width)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  Long LVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  BATransformer *in_RDI;
  IntVect IVar8;
  Box *thisbox_2;
  Long ibox_2;
  Box result;
  Box bx;
  Box *thisbox_1;
  Long ibox_1;
  IntVect cr;
  IndexType t;
  Box *thisbox;
  Long ibox;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *bxs;
  bool res;
  Box *first;
  Long sz;
  int dir;
  IntVect off;
  int off_1;
  uint bitval;
  uint typ;
  int dir_1;
  BoxArray *in_stack_fffffffffffffbd8;
  undefined6 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe6;
  undefined1 in_stack_fffffffffffffbe7;
  undefined8 in_stack_fffffffffffffbe8;
  BoxArray *in_stack_fffffffffffffbf0;
  int local_404;
  int local_400;
  int local_3fc;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  int local_394;
  int local_390;
  int local_38c;
  int local_384;
  int local_380;
  int local_37c;
  int local_374;
  int local_370;
  int local_36c;
  Box *in_stack_fffffffffffffca8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  BATbndryReg *in_stack_fffffffffffffcb0;
  bool local_341;
  undefined1 local_334 [28];
  undefined1 *local_318;
  long local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  uint local_2f0;
  undefined4 local_2ec;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  long local_2c8;
  undefined8 local_2c0;
  int local_2b8;
  undefined8 local_2b0;
  int local_2a8;
  uint local_2a4;
  Box *local_2a0;
  long local_298;
  element_type *local_290;
  byte local_285;
  undefined1 local_284 [28];
  undefined1 *local_268;
  Long local_260;
  bool local_23d;
  uint local_23c;
  uint *local_238;
  undefined8 *local_230;
  int *local_228;
  Box *local_220;
  int local_218;
  IntVect local_214;
  int *local_208;
  undefined8 *local_200;
  int local_1f8;
  uint local_1f4;
  uint local_1f0;
  int local_1ec;
  undefined4 *local_1e8;
  uint local_1dc;
  uint local_1d8;
  int local_1d4;
  undefined1 *local_1d0;
  int local_1c4;
  long local_1c0;
  int local_1b4;
  int *local_1b0;
  IntVect *local_1a8;
  int *local_1a0;
  undefined4 local_194;
  IntVect *local_190;
  undefined4 local_184;
  IntVect *local_180;
  undefined4 local_174;
  IntVect *local_170;
  undefined4 local_164;
  int *local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  long local_140;
  int *local_138;
  undefined8 *local_130;
  uint *local_128;
  int local_11c;
  undefined1 *local_118;
  int local_10c;
  uint *local_108;
  int local_fc;
  uint *local_f8;
  undefined4 local_f0;
  int local_ec;
  IntVect *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  uint *local_70;
  int local_64;
  uint *local_60;
  int local_54;
  undefined1 *local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  undefined1 *local_30;
  int local_24;
  undefined1 *local_20;
  int local_18;
  int local_14;
  undefined1 *local_10;
  int local_4;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  local_260 = size((BoxArray *)0x1258a94);
  LVar4 = size((BoxArray *)0x1258aa9);
  if (LVar4 == 0) {
    local_23d = false;
  }
  else {
    operator[](in_stack_fffffffffffffbf0,iVar6);
    local_268 = local_284;
    local_285 = Box::coarsenable((Box *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ),
                                 (IntVect *)
                                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                 (IntVect *)
                                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    if ((bool)local_285) {
      local_290 = std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1258b38);
      bVar3 = BATransformer::is_null(in_RDI);
      if (bVar3) {
        for (local_298 = 0; local_298 < local_260; local_298 = local_298 + 1) {
          local_2a0 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                 CONCAT17(in_stack_fffffffffffffbe7,
                                          CONCAT16(in_stack_fffffffffffffbe6,
                                                   in_stack_fffffffffffffbe0)),
                                 (size_type)in_stack_fffffffffffffbd8);
          local_341 = false;
          if ((local_285 & 1) != 0) {
            local_341 = Box::coarsenable((Box *)CONCAT44(in_stack_fffffffffffffd2c,
                                                         in_stack_fffffffffffffd28),
                                         (IntVect *)
                                         CONCAT44(in_stack_fffffffffffffd24,
                                                  in_stack_fffffffffffffd20),
                                         (IntVect *)
                                         CONCAT44(in_stack_fffffffffffffd1c,
                                                  in_stack_fffffffffffffd18));
          }
          local_285 = local_341;
        }
      }
      else {
        bVar3 = BATransformer::is_simple(in_RDI);
        if (bVar3) {
          local_2a4 = (uint)ixType(in_stack_fffffffffffffbd8);
          IVar8 = crseRatio(in_stack_fffffffffffffbf0);
          local_2c0 = IVar8.vect._0_8_;
          local_2b0 = local_2c0;
          local_2b8 = IVar8.vect[2];
          local_2a8 = local_2b8;
          for (local_2c8 = 0; local_2c8 < local_260; local_2c8 = local_2c8 + 1) {
            local_220 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                                  ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                   CONCAT17(in_stack_fffffffffffffbe7,
                                            CONCAT16(in_stack_fffffffffffffbe6,
                                                     in_stack_fffffffffffffbe0)),
                                   (size_type)in_stack_fffffffffffffbd8);
            local_228 = (int *)&local_2b0;
            lVar1 = *(long *)(local_220->smallend).vect;
            local_300 = *(long *)((local_220->smallend).vect + 2);
            lVar2 = *(long *)((local_220->bigend).vect + 1);
            uVar7 = (local_220->btype).itype;
            puVar9 = &local_308;
            local_164 = 1;
            bVar3 = true;
            if (((int)local_2b0 == 1) && (bVar3 = true, local_2b0._4_4_ == 1)) {
              bVar3 = local_2a8 != 1;
            }
            local_308 = lVar1;
            local_2f8 = lVar2;
            local_208 = local_228;
            local_200 = puVar9;
            local_160 = local_228;
            if (bVar3) {
              local_308._0_4_ = (int)lVar1;
              local_c4 = (int)local_308;
              local_c8 = (int)local_2b0;
              local_c0 = local_c4;
              if ((int)local_2b0 != 1) {
                if ((int)local_2b0 == 2) {
                  if ((int)local_308 < 0) {
                    iVar6 = (int)local_308 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_36c = -iVar6 / 2 + -1;
                  }
                  else {
                    local_36c = (int)local_308 / 2;
                  }
                  local_c0 = local_36c;
                }
                else if ((int)local_2b0 == 4) {
                  if ((int)local_308 < 0) {
                    iVar6 = (int)local_308 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_370 = -iVar6 / 4 + -1;
                  }
                  else {
                    local_370 = (int)local_308 / 4;
                  }
                  local_c0 = local_370;
                }
                else {
                  if ((int)local_308 < 0) {
                    iVar6 = (int)local_308 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_374 = -iVar6 / (int)local_2b0 + -1;
                  }
                  else {
                    local_374 = (int)local_308 / (int)local_2b0;
                  }
                  local_c0 = local_374;
                }
              }
              local_308._4_4_ = (int)((ulong)lVar1 >> 0x20);
              local_d0 = local_308._4_4_;
              local_308._0_4_ = local_c0;
              local_d4 = local_2b0._4_4_;
              local_cc = local_d0;
              if (local_2b0._4_4_ != 1) {
                if (local_2b0._4_4_ == 2) {
                  if (lVar1 < 0) {
                    iVar6 = local_d0 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_37c = -iVar6 / 2 + -1;
                  }
                  else {
                    local_37c = local_d0 / 2;
                  }
                  local_cc = local_37c;
                }
                else if (local_2b0._4_4_ == 4) {
                  if (lVar1 < 0) {
                    iVar6 = local_d0 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_380 = -iVar6 / 4 + -1;
                  }
                  else {
                    local_380 = local_d0 / 4;
                  }
                  local_cc = local_380;
                }
                else {
                  if (lVar1 < 0) {
                    iVar6 = local_d0 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_384 = -iVar6 / local_2b0._4_4_ + -1;
                  }
                  else {
                    local_384 = local_d0 / local_2b0._4_4_;
                  }
                  local_cc = local_384;
                }
              }
              local_308._4_4_ = local_cc;
              local_dc = (int)local_300;
              local_e0 = local_2a8;
              local_d8 = local_dc;
              if (local_2a8 != 1) {
                if (local_2a8 == 2) {
                  if ((int)local_300 < 0) {
                    iVar6 = (int)local_300 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_38c = -iVar6 / 2 + -1;
                  }
                  else {
                    local_38c = (int)local_300 / 2;
                  }
                  local_d8 = local_38c;
                }
                else if (local_2a8 == 4) {
                  if ((int)local_300 < 0) {
                    iVar6 = (int)local_300 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_390 = -iVar6 / 4 + -1;
                  }
                  else {
                    local_390 = (int)local_300 / 4;
                  }
                  local_d8 = local_390;
                }
                else {
                  if ((int)local_300 < 0) {
                    iVar6 = (int)local_300 + 1;
                    if (iVar6 < 1) {
                      iVar6 = -iVar6;
                    }
                    local_394 = -iVar6 / local_2a8 + -1;
                  }
                  else {
                    local_394 = (int)local_300 / local_2a8;
                  }
                  local_d8 = local_394;
                }
              }
              local_300._0_4_ = local_d8;
              local_128 = &local_2f0;
              local_138 = local_228;
              local_130 = puVar9;
              if (local_2f0 == 0) {
                local_140 = (long)&local_300 + 4;
                local_a0 = local_300._4_4_;
                local_a4 = (int)local_2b0;
                local_9c = local_a0;
                if ((int)local_2b0 != 1) {
                  if ((int)local_2b0 == 2) {
                    if (local_300 < 0) {
                      iVar6 = local_300._4_4_ + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3dc = -iVar6 / 2 + -1;
                    }
                    else {
                      local_3dc = local_300._4_4_ / 2;
                    }
                    local_9c = local_3dc;
                  }
                  else if ((int)local_2b0 == 4) {
                    if (local_300 < 0) {
                      iVar6 = local_300._4_4_ + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3e0 = -iVar6 / 4 + -1;
                    }
                    else {
                      local_3e0 = local_300._4_4_ / 4;
                    }
                    local_9c = local_3e0;
                  }
                  else {
                    if (local_300 < 0) {
                      iVar6 = local_300._4_4_ + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3e4 = -iVar6 / (int)local_2b0 + -1;
                    }
                    else {
                      local_3e4 = local_300._4_4_ / (int)local_2b0;
                    }
                    local_9c = local_3e4;
                  }
                }
                local_300._4_4_ = local_9c;
                local_2f8._0_4_ = (int)lVar2;
                local_ac = (int)local_2f8;
                local_b0 = local_2b0._4_4_;
                local_a8 = local_ac;
                if (local_2b0._4_4_ != 1) {
                  if (local_2b0._4_4_ == 2) {
                    if ((int)local_2f8 < 0) {
                      iVar6 = (int)local_2f8 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3ec = -iVar6 / 2 + -1;
                    }
                    else {
                      local_3ec = (int)local_2f8 / 2;
                    }
                    local_a8 = local_3ec;
                  }
                  else if (local_2b0._4_4_ == 4) {
                    if ((int)local_2f8 < 0) {
                      iVar6 = (int)local_2f8 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3f0 = -iVar6 / 4 + -1;
                    }
                    else {
                      local_3f0 = (int)local_2f8 / 4;
                    }
                    local_a8 = local_3f0;
                  }
                  else {
                    if ((int)local_2f8 < 0) {
                      iVar6 = (int)local_2f8 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3f4 = -iVar6 / local_2b0._4_4_ + -1;
                    }
                    else {
                      local_3f4 = (int)local_2f8 / local_2b0._4_4_;
                    }
                    local_a8 = local_3f4;
                  }
                }
                local_2f8._4_4_ = (int)((ulong)lVar2 >> 0x20);
                local_b8 = local_2f8._4_4_;
                local_2f8._0_4_ = local_a8;
                local_bc = local_2a8;
                local_b4 = local_b8;
                if (local_2a8 != 1) {
                  if (local_2a8 == 2) {
                    if (lVar2 < 0) {
                      iVar6 = local_b8 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3fc = -iVar6 / 2 + -1;
                    }
                    else {
                      local_3fc = local_b8 / 2;
                    }
                    local_b4 = local_3fc;
                  }
                  else if (local_2a8 == 4) {
                    if (lVar2 < 0) {
                      iVar6 = local_b8 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_400 = -iVar6 / 4 + -1;
                    }
                    else {
                      local_400 = local_b8 / 4;
                    }
                    local_b4 = local_400;
                  }
                  else {
                    if (lVar2 < 0) {
                      iVar6 = local_b8 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_404 = -iVar6 / local_2a8 + -1;
                    }
                    else {
                      local_404 = local_b8 / local_2a8;
                    }
                    local_b4 = local_404;
                  }
                }
                local_2f8._4_4_ = local_b4;
                local_2f8 = local_2f8;
                local_148 = local_228;
              }
              else {
                local_2f0 = uVar7;
                IntVect::IntVect(&local_214,0);
                for (local_218 = 0; local_218 < 3; local_218 = local_218 + 1) {
                  local_f8 = (uint *)(puVar9 + 3);
                  local_fc = local_218;
                  local_74 = local_218;
                  local_3c = local_218;
                  if ((*local_f8 & 1 << ((byte)local_218 & 0x1f)) != 0) {
                    local_1c0 = (long)puVar9 + 0xc;
                    local_1c4 = local_218;
                    local_1b0 = local_208;
                    local_1b4 = local_218;
                    if (*(int *)(local_1c0 + (long)local_218 * 4) % local_208[local_218] != 0) {
                      local_e8 = &local_214;
                      local_ec = local_218;
                      local_f0 = 1;
                      local_e8->vect[local_218] = 1;
                    }
                  }
                  local_70 = local_f8;
                }
                local_150 = (int *)((long)puVar9 + 0xc);
                local_158 = local_208;
                local_7c = *local_150;
                local_80 = *local_208;
                local_78 = local_7c;
                if (local_80 != 1) {
                  if (local_80 == 2) {
                    if (local_7c < 0) {
                      iVar6 = local_7c + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3a4 = -iVar6 / 2 + -1;
                    }
                    else {
                      local_3a4 = local_7c / 2;
                    }
                    local_78 = local_3a4;
                  }
                  else if (local_80 == 4) {
                    if (local_7c < 0) {
                      iVar6 = local_7c + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3a8 = -iVar6 / 4 + -1;
                    }
                    else {
                      local_3a8 = local_7c / 4;
                    }
                    local_78 = local_3a8;
                  }
                  else {
                    if (local_7c < 0) {
                      iVar6 = local_7c + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3ac = -iVar6 / local_80 + -1;
                    }
                    else {
                      local_3ac = local_7c / local_80;
                    }
                    local_78 = local_3ac;
                  }
                }
                puVar10 = puVar9;
                *local_150 = local_78;
                local_88 = *(int *)(puVar9 + 2);
                local_8c = local_158[1];
                local_84 = local_88;
                if (local_8c != 1) {
                  if (local_8c == 2) {
                    if (local_88 < 0) {
                      iVar6 = local_88 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3b4 = -iVar6 / 2 + -1;
                    }
                    else {
                      local_3b4 = local_88 / 2;
                    }
                    local_84 = local_3b4;
                  }
                  else if (local_8c == 4) {
                    if (local_88 < 0) {
                      iVar6 = local_88 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3b8 = -iVar6 / 4 + -1;
                    }
                    else {
                      local_3b8 = local_88 / 4;
                    }
                    local_84 = local_3b8;
                  }
                  else {
                    if (local_88 < 0) {
                      iVar6 = local_88 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3bc = -iVar6 / local_8c + -1;
                    }
                    else {
                      local_3bc = local_88 / local_8c;
                    }
                    local_84 = local_3bc;
                  }
                }
                *(int *)(puVar9 + 2) = local_84;
                local_94 = *(int *)((long)puVar9 + 0x14);
                local_98 = local_158[2];
                local_90 = local_94;
                if (local_98 != 1) {
                  if (local_98 == 2) {
                    if (local_94 < 0) {
                      iVar6 = local_94 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3c4 = -iVar6 / 2 + -1;
                    }
                    else {
                      local_3c4 = local_94 / 2;
                    }
                    local_90 = local_3c4;
                  }
                  else if (local_98 == 4) {
                    if (local_94 < 0) {
                      iVar6 = local_94 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3c8 = -iVar6 / 4 + -1;
                    }
                    else {
                      local_3c8 = local_94 / 4;
                    }
                    local_90 = local_3c8;
                  }
                  else {
                    if (local_94 < 0) {
                      iVar6 = local_94 + 1;
                      if (iVar6 < 1) {
                        iVar6 = -iVar6;
                      }
                      local_3cc = -iVar6 / local_98 + -1;
                    }
                    else {
                      local_3cc = local_94 / local_98;
                    }
                    local_90 = local_3cc;
                  }
                }
                *(int *)((long)puVar9 + 0x14) = local_90;
                local_1a0 = (int *)((long)puVar10 + 0xc);
                local_1a8 = &local_214;
                local_174 = 0;
                local_170 = local_1a8;
                *local_1a0 = local_214.vect[0] + *local_1a0;
                local_180 = local_1a8;
                local_184 = 1;
                *(int *)(puVar10 + 2) = local_1a8->vect[1] + *(int *)(puVar10 + 2);
                local_190 = local_1a8;
                local_194 = 2;
                *(int *)((long)puVar10 + 0x14) = local_1a8->vect[2] + *(int *)((long)puVar10 + 0x14)
                ;
                uVar7 = local_2f0;
              }
            }
            local_2f0 = uVar7;
            local_230 = &local_308;
            local_238 = &local_2a4;
            local_2ec = (undefined4)local_308;
            local_23c = local_2a4;
            local_1e8 = &local_2ec;
            uVar7 = local_2f0;
            for (local_1ec = 0; local_1ec < 3; local_1ec = local_1ec + 1) {
              local_108 = &local_1dc;
              local_10c = local_1ec;
              local_64 = local_1ec;
              local_40 = local_1ec;
              bVar5 = (byte)local_1ec;
              local_1f0 = (uint)((local_2a4 & 1 << (bVar5 & 0x1f)) != 0);
              local_118 = &stack0xfffffffffffffd2c;
              local_11c = local_1ec;
              local_54 = local_1ec;
              local_44 = local_1ec;
              local_1f4 = (uint)((uVar7 & 1 << (bVar5 & 0x1f)) != 0);
              local_1f8 = local_1f0 - local_1f4;
              local_30 = &stack0xfffffffffffffd20;
              local_34 = local_1ec;
              *(int *)(local_30 + (long)local_1ec * 4) =
                   local_1f8 + *(int *)(local_30 + (long)local_1ec * 4);
              local_1d0 = &stack0xfffffffffffffd2c;
              local_1d4 = local_1ec;
              if (local_1f0 == 0) {
                local_24 = local_1ec;
                local_18 = local_1ec;
                uVar7 = (1 << (bVar5 & 0x1f) ^ 0xffffffffU) & uVar7;
                local_20 = local_1d0;
              }
              else {
                local_14 = local_1ec;
                local_4 = local_1ec;
                uVar7 = 1 << (bVar5 & 0x1f) | uVar7;
                local_10 = local_1d0;
              }
              local_1d8 = local_1f0;
              local_60 = local_108;
              local_50 = local_118;
              local_38 = local_1f8;
            }
            in_stack_fffffffffffffbe7 = false;
            local_1dc = local_23c;
            if ((local_285 & 1) != 0) {
              in_stack_fffffffffffffbe7 =
                   Box::coarsenable((Box *)CONCAT44(uVar7,(int)((ulong)local_2f8 >> 0x20)),
                                    (IntVect *)
                                    CONCAT44((int)local_2f8,(int)((ulong)local_300 >> 0x20)),
                                    (IntVect *)
                                    CONCAT44((int)local_300,(int)((ulong)local_308 >> 0x20)));
            }
            local_285 = in_stack_fffffffffffffbe7;
          }
        }
        else {
          for (local_310 = 0; local_310 < local_260; local_310 = local_310 + 1) {
            Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                      ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                       CONCAT17(in_stack_fffffffffffffbe7,
                                CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),
                       (size_type)&in_RDI->m_op);
            BATbndryReg::operator()(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
            local_318 = local_334;
            in_stack_fffffffffffffbe6 = false;
            if ((local_285 & 1) != 0) {
              in_stack_fffffffffffffbe6 =
                   Box::coarsenable((Box *)CONCAT44(in_stack_fffffffffffffd2c,
                                                    in_stack_fffffffffffffd28),
                                    (IntVect *)
                                    CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                    (IntVect *)
                                    CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            }
            local_285 = in_stack_fffffffffffffbe6;
          }
        }
      }
      local_23d = (bool)(local_285 & 1);
    }
    else {
      local_23d = false;
    }
  }
  return local_23d;
}

Assistant:

bool
BoxArray::coarsenable (const IntVect& refinement_ratio, const IntVect& min_width) const
{
    const Long sz = size();
    if(size() == 0) return false;

    const Box& first = (*this)[0];
    bool res = first.coarsenable(refinement_ratio,min_width);
    if (res == false) return false;

    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = bxs[ibox];
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = amrex::convert(amrex::coarsen(bxs[ibox],cr),t);
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = m_bat.m_op.m_bndryReg(bxs[ibox]);
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    }

    return res;
}